

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_tests.cpp
# Opt level: O0

void ConcatTestCheckCount(char *name,int num)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_400;
  Fixed local_3d0;
  int local_244;
  undefined1 local_240 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_210;
  Fixed local_1e0;
  undefined1 local_48 [8];
  AssertionResult iutest_ar;
  TestSuite *p;
  char *pcStack_10;
  int num_local;
  char *name_local;
  
  p._4_4_ = num;
  pcStack_10 = name;
  iutest_ar._32_8_ = iuutil::FindTestSuite(name);
  iutest::detail::AlwaysZero();
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestSuite>
            ((AssertionResult *)local_48,"(p)",(TestSuite *)iutest_ar._32_8_);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_48);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/concat_tests.cpp"
               ,0x43,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_244 = iutest::TestSuite::total_test_count((TestSuite *)iutest_ar._32_8_);
    iutest::internal::backward::EqHelper<false>::Compare<int>
              ((AssertionResult *)local_240,"num","p->total_test_count()",(int *)((long)&p + 4),
               &local_244);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      memset(&local_3d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3d0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_240);
      iutest::AssertionHelper::AssertionHelper
                (&local_400,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/concat_tests.cpp"
                 ,0x44,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_400,&local_3d0);
      iutest::AssertionHelper::~AssertionHelper(&local_400);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3d0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  }
  return;
}

Assistant:

void ConcatTestCheckCount(const char* name, int num)
{
    const ::iutest::TestSuite* p = ::iuutil::FindTestSuite(name);
    IUTEST_ASSERT_NOTNULL(p);
    IUTEST_ASSERT_EQ(num, p->total_test_count());
}